

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O2

EmitExpressionInfo __thiscall
Js::AsmJSByteCodeGenerator::EmitIf(AsmJSByteCodeGenerator *this,ParseNodeIf *pnode)

{
  AsmJsByteCodeWriter *this_00;
  ByteCodeLabel BVar1;
  ByteCodeLabel falseLabel;
  EmitExpressionInfo EVar2;
  EmitExpressionInfo local_48;
  EmitExpressionInfo local_40;
  EmitExpressionInfo local_38;
  
  this_00 = &this->mWriter;
  BVar1 = ByteCodeWriter::DefineLabel(&this_00->super_ByteCodeWriter);
  falseLabel = ByteCodeWriter::DefineLabel(&this_00->super_ByteCodeWriter);
  local_48 = EmitBooleanExpression(this,pnode->pnodeCond,BVar1,falseLabel);
  AsmJsFunc::ReleaseLocation<int>(this->mFunction,&local_48);
  AsmJsByteCodeWriter::MarkAsmJsLabel(this_00,BVar1);
  local_40 = Emit(this,pnode->pnodeTrue);
  AsmJsFunc::ReleaseLocationGeneric(this->mFunction,&local_40);
  if (pnode->pnodeFalse != (ParseNodePtr)0x0) {
    BVar1 = ByteCodeWriter::DefineLabel(&this_00->super_ByteCodeWriter);
    ByteCodeWriter::RecordStatementAdjustment(&this_00->super_ByteCodeWriter,SAT_FromCurrentToNext);
    AsmJsByteCodeWriter::AsmBr(this_00,BVar1,AsmBr);
    AsmJsByteCodeWriter::MarkAsmJsLabel(this_00,falseLabel);
    local_38 = Emit(this,pnode->pnodeFalse);
    AsmJsFunc::ReleaseLocationGeneric(this->mFunction,&local_38);
    falseLabel = BVar1;
  }
  AsmJsByteCodeWriter::MarkAsmJsLabel(this_00,falseLabel);
  if ((pnode->super_ParseNodeStmt).emitLabels == true) {
    AsmJsByteCodeWriter::MarkAsmJsLabel(this_00,(pnode->super_ParseNodeStmt).breakLabel);
  }
  EVar2.super_EmitInfoBase.location = 0xffffffff;
  EVar2.type.which_ = Void;
  return EVar2;
}

Assistant:

EmitExpressionInfo AsmJSByteCodeGenerator::EmitIf( ParseNodeIf * pnode )
    {
        Js::ByteCodeLabel trueLabel = mWriter.DefineLabel();
        Js::ByteCodeLabel falseLabel = mWriter.DefineLabel();
        const EmitExpressionInfo& boolInfo = EmitBooleanExpression( pnode->pnodeCond, trueLabel, falseLabel );
        mFunction->ReleaseLocation<int>( &boolInfo );


        mWriter.MarkAsmJsLabel( trueLabel );

        const EmitExpressionInfo& trueInfo = Emit( pnode->pnodeTrue );
        mFunction->ReleaseLocationGeneric( &trueInfo );

        if( pnode->pnodeFalse != nullptr )
        {
            // has else clause
            Js::ByteCodeLabel skipLabel = mWriter.DefineLabel();

            // Record the branch bytecode offset
            mWriter.RecordStatementAdjustment( Js::FunctionBody::SAT_FromCurrentToNext );

            // then clause skips else clause
            mWriter.AsmBr( skipLabel );
            // generate code for else clause
            mWriter.MarkAsmJsLabel( falseLabel );

            const EmitExpressionInfo& falseInfo = Emit( pnode->pnodeFalse );
            mFunction->ReleaseLocationGeneric( &falseInfo );

            mWriter.MarkAsmJsLabel( skipLabel );

        }
        else
        {
            mWriter.MarkAsmJsLabel( falseLabel );
        }
        if( pnode->emitLabels )
        {
            mWriter.MarkAsmJsLabel( pnode->breakLabel );
        }
        return EmitExpressionInfo( AsmJsType::Void );
    }